

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O3

void srunner_free(SRunner *sr)

{
  List *pLVar1;
  List *lp;
  int iVar2;
  void *__ptr;
  void *__ptr_00;
  TestResult *tr;
  
  if (sr != (SRunner *)0x0) {
    free(sr->stats);
    pLVar1 = sr->slst;
    check_list_front(pLVar1);
    iVar2 = check_list_at_end(pLVar1);
    while (iVar2 == 0) {
      __ptr = check_list_val(pLVar1);
      if (__ptr != (void *)0x0) {
        lp = *(List **)((long)__ptr + 8);
        check_list_front(lp);
        while (iVar2 = check_list_at_end(lp), iVar2 == 0) {
          __ptr_00 = check_list_val(lp);
          check_list_apply(*(List **)((long)__ptr_00 + 0x18),free);
          check_list_apply(*(List **)((long)__ptr_00 + 0x20),free);
          check_list_apply(*(List **)((long)__ptr_00 + 0x30),free);
          check_list_apply(*(List **)((long)__ptr_00 + 0x28),free);
          check_list_apply(*(List **)((long)__ptr_00 + 0x38),free);
          check_list_apply(*(List **)((long)__ptr_00 + 0x40),free);
          check_list_free(*(List **)((long)__ptr_00 + 0x18));
          check_list_free(*(List **)((long)__ptr_00 + 0x20));
          check_list_free(*(List **)((long)__ptr_00 + 0x30));
          check_list_free(*(List **)((long)__ptr_00 + 0x28));
          check_list_free(*(List **)((long)__ptr_00 + 0x38));
          check_list_free(*(List **)((long)__ptr_00 + 0x40));
          free(__ptr_00);
          check_list_advance(lp);
        }
        check_list_free(*(List **)((long)__ptr + 8));
        free(__ptr);
      }
      check_list_advance(pLVar1);
      iVar2 = check_list_at_end(pLVar1);
    }
    check_list_free(sr->slst);
    pLVar1 = sr->resultlst;
    check_list_front(pLVar1);
    while (iVar2 = check_list_at_end(pLVar1), iVar2 == 0) {
      tr = (TestResult *)check_list_val(pLVar1);
      tr_free(tr);
      check_list_advance(pLVar1);
    }
    check_list_free(sr->resultlst);
    free(sr);
    return;
  }
  return;
}

Assistant:

void srunner_free(SRunner * sr)
{
    List *l;

    if(sr == NULL)
        return;

    free(sr->stats);
    l = sr->slst;
    for(check_list_front(l); !check_list_at_end(l); check_list_advance(l))
    {
        suite_free((Suite *)check_list_val(l));
    }
    check_list_free(sr->slst);

    l = sr->resultlst;
    for(check_list_front(l); !check_list_at_end(l); check_list_advance(l))
    {
        TestResult *tr = (TestResult *)check_list_val(l);
        tr_free(tr);
    }
    check_list_free(sr->resultlst);

    free(sr);
}